

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

uint32_t __thiscall jbcoin::STObject::getFlags(STObject *this)

{
  STBase *pSVar1;
  int iVar2;
  long lVar3;
  uint32_t uVar4;
  
  iVar2 = getFieldIndex(this,(SField *)sfFlags);
  uVar4 = 0;
  if ((iVar2 != -1) &&
     (pSVar1 = (this->v_).
               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar2].p_, uVar4 = 0,
     pSVar1 != (STBase *)0x0)) {
    uVar4 = 0;
    lVar3 = __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
    if (lVar3 != 0) {
      uVar4 = *(uint32_t *)(lVar3 + 0x10);
    }
  }
  return uVar4;
}

Assistant:

std::uint32_t STObject::getFlags (void) const
{
    const STUInt32* t = dynamic_cast<const STUInt32*> (peekAtPField (sfFlags));

    if (!t)
        return 0;

    return t->value ();
}